

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_iejoin.cpp
# Opt level: O3

void duckdb::IEJoinUnion::Sort(SortedTable *table)

{
  GlobalSortState *this;
  pointer *__ptr_2;
  pointer *__ptr;
  pointer *__ptr_1;
  undefined1 local_70 [24];
  _Head_base<0UL,_duckdb::SBScanState_*,_false> local_58;
  _Head_base<0UL,_duckdb::SBScanState_*,_false> local_50;
  __uniq_ptr_impl<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>_> local_48;
  _Head_base<0UL,_duckdb::SortedBlock_*,_false> local_40;
  
  this = &table->global_sort_state;
  GlobalSortState::PrepareMergePhase(this);
  if (8 < (ulong)((long)(table->global_sort_state).sorted_blocks.
                        super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                        .
                        super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(table->global_sort_state).sorted_blocks.
                       super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                       .
                       super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)) {
    do {
      GlobalSortState::InitializeMergeRound(this);
      MergeSorter::MergeSorter
                ((MergeSorter *)local_70,this,(table->global_sort_state).buffer_manager);
      MergeSorter::PerformInMergeRound((MergeSorter *)local_70);
      GlobalSortState::CompleteMergeRound(this,true);
      if (local_40._M_head_impl != (SortedBlock *)0x0) {
        ::std::default_delete<duckdb::SortedBlock>::operator()
                  ((default_delete<duckdb::SortedBlock> *)&local_40,local_40._M_head_impl);
      }
      local_40._M_head_impl = (SortedBlock *)0x0;
      if ((_Tuple_impl<0UL,_duckdb::SortedBlock_*,_std::default_delete<duckdb::SortedBlock>_>)
          local_48._M_t.
          super__Tuple_impl<0UL,_duckdb::SortedBlock_*,_std::default_delete<duckdb::SortedBlock>_>.
          super__Head_base<0UL,_duckdb::SortedBlock_*,_false>._M_head_impl != (SortedBlock *)0x0) {
        ::std::default_delete<duckdb::SortedBlock>::operator()
                  ((default_delete<duckdb::SortedBlock> *)&local_48,
                   (SortedBlock *)
                   local_48._M_t.
                   super__Tuple_impl<0UL,_duckdb::SortedBlock_*,_std::default_delete<duckdb::SortedBlock>_>
                   .super__Head_base<0UL,_duckdb::SortedBlock_*,_false>._M_head_impl);
      }
      local_48._M_t.
      super__Tuple_impl<0UL,_duckdb::SortedBlock_*,_std::default_delete<duckdb::SortedBlock>_>.
      super__Head_base<0UL,_duckdb::SortedBlock_*,_false>._M_head_impl =
           (tuple<duckdb::SortedBlock_*,_std::default_delete<duckdb::SortedBlock>_>)0x0;
      if ((_Head_base<0UL,_duckdb::SBScanState_*,_false>)local_50._M_head_impl !=
          (_Head_base<0UL,_duckdb::SBScanState_*,_false>)0x0) {
        ::std::default_delete<duckdb::SBScanState>::operator()
                  ((default_delete<duckdb::SBScanState> *)&local_50,local_50._M_head_impl);
      }
      local_50._M_head_impl = (SBScanState *)0x0;
      if (local_58._M_head_impl != (SBScanState *)0x0) {
        ::std::default_delete<duckdb::SBScanState>::operator()
                  ((default_delete<duckdb::SBScanState> *)&local_58,local_58._M_head_impl);
      }
    } while (8 < (ulong)((long)(table->global_sort_state).sorted_blocks.
                               super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                               .
                               super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(table->global_sort_state).sorted_blocks.
                              super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                              .
                              super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                              ._M_impl.super__Vector_impl_data._M_start));
  }
  return;
}

Assistant:

static void Sort(SortedTable &table) {
		auto &global_sort_state = table.global_sort_state;
		global_sort_state.PrepareMergePhase();
		while (global_sort_state.sorted_blocks.size() > 1) {
			global_sort_state.InitializeMergeRound();
			MergeSorter merge_sorter(global_sort_state, global_sort_state.buffer_manager);
			merge_sorter.PerformInMergeRound();
			global_sort_state.CompleteMergeRound(true);
		}
	}